

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

int ucstricmp(qsizetype alen,char16_t *a,qsizetype blen,char16_t *b)

{
  char32_t cVar1;
  char32_t cVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  char32_t blast;
  char32_t alast;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (a == b) {
    iVar3 = ((blen < alen) - 1) + (uint)(blen < alen);
    if (alen == blen) {
      iVar3 = 0;
    }
  }
  else {
    alast = L'\0';
    blast = L'\0';
    lVar5 = blen;
    if (alen < blen) {
      lVar5 = alen;
    }
    lVar4 = 0;
    if (lVar5 < 1) {
      lVar5 = lVar4;
    }
    do {
      if (lVar5 == lVar4) {
        if (lVar5 == alen) {
          iVar3 = -(uint)(alen != blen);
        }
        else {
          iVar3 = 1;
        }
        break;
      }
      cVar1 = foldCase((uint)(ushort)a[lVar4],&alast);
      cVar2 = foldCase((uint)(ushort)b[lVar4],&blast);
      lVar4 = lVar4 + 1;
      iVar3 = cVar1 - cVar2;
    } while (iVar3 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

Q_NEVER_INLINE static int ucstricmp(qsizetype alen, const char16_t *a, qsizetype blen, const char16_t *b)
{
    if (a == b)
        return qt_lencmp(alen, blen);

    char32_t alast = 0;
    char32_t blast = 0;
    qsizetype l = qMin(alen, blen);
    qsizetype i;
    for (i = 0; i < l; ++i) {
//         qDebug() << Qt::hex << alast << blast;
//         qDebug() << Qt::hex << "*a=" << *a << "alast=" << alast << "folded=" << foldCase (*a, alast);
//         qDebug() << Qt::hex << "*b=" << *b << "blast=" << blast << "folded=" << foldCase (*b, blast);
        int diff = foldCase(a[i], alast) - foldCase(b[i], blast);
        if ((diff))
            return diff;
    }
    if (i == alen) {
        if (i == blen)
            return 0;
        return -1;
    }
    return 1;
}